

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void do_with_oh_void(qpdf_data qpdf,qpdf_oh oh,function<void_(QPDFObjectHandle_&)> *fn)

{
  function<void_(QPDFObjectHandle_&)> local_88;
  function<bool_(QPDFObjectHandle_&)> local_68;
  bool local_41;
  function<bool_()> local_40;
  function<void_(QPDFObjectHandle_&)> *local_20;
  function<void_(QPDFObjectHandle_&)> *fn_local;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_41 = false;
  local_20 = fn;
  fn_local._4_4_ = oh;
  p_Stack_10 = qpdf;
  return_T<bool>(&local_40,&local_41);
  std::function<void_(QPDFObjectHandle_&)>::function(&local_88,fn);
  std::function<bool(QPDFObjectHandle&)>::
  function<do_with_oh_void(_qpdf_data*,unsigned_int,std::function<void(QPDFObjectHandle&)>)::__0,void>
            ((function<bool(QPDFObjectHandle&)> *)&local_68,(anon_class_32_1_3fcf6586 *)&local_88);
  do_with_oh<bool>(qpdf,oh,&local_40,&local_68);
  std::function<bool_(QPDFObjectHandle_&)>::~function(&local_68);
  do_with_oh_void(_qpdf_data*,unsigned_int,std::function<void(QPDFObjectHandle&)>)::$_0::~__0
            ((__0 *)&local_88);
  std::function<bool_()>::~function(&local_40);
  return;
}

Assistant:

static void
do_with_oh_void(qpdf_data qpdf, qpdf_oh oh, std::function<void(QPDFObjectHandle&)> fn)
{
    do_with_oh<bool>(qpdf, oh, return_T<bool>(false), [fn](QPDFObjectHandle& o) {
        fn(o);
        return true; // unused
    });
}